

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfRgbaFile.cpp
# Opt level: O0

void __thiscall
Imf_3_4::RgbaInputFile::setPartAndLayer(RgbaInputFile *this,int part,string *layerName)

{
  void *pvVar1;
  RgbaChannels RVar2;
  InputPart *this_00;
  InputPart *in_RDX;
  undefined4 in_ESI;
  long in_RDI;
  FrameBuffer fb;
  RgbaChannels rgbaChannels;
  FrameBuffer *frameBuffer;
  RgbaInputFile *in_stack_ffffffffffffff50;
  MultiPartInputFile *in_stack_ffffffffffffff58;
  FromYca *in_stack_ffffffffffffff60;
  Header *in_stack_ffffffffffffff80;
  string *in_stack_ffffffffffffff88;
  string local_48 [44];
  RgbaChannels in_stack_ffffffffffffffe4;
  undefined4 in_stack_fffffffffffffff0;
  
  pvVar1 = *(void **)(in_RDI + 0x18);
  if (pvVar1 != (void *)0x0) {
    FromYca::~FromYca(in_stack_ffffffffffffff60);
    operator_delete(pvVar1,0x188);
  }
  *(undefined8 *)(in_RDI + 0x18) = 0;
  if (*(void **)(in_RDI + 0x10) != (void *)0x0) {
    operator_delete(*(void **)(in_RDI + 0x10),8);
  }
  *(undefined8 *)(in_RDI + 0x10) = 0;
  this_00 = (InputPart *)operator_new(8);
  InputPart::InputPart
            (this_00,in_stack_ffffffffffffff58,(int)((ulong)in_stack_ffffffffffffff50 >> 0x20));
  *(InputPart **)(in_RDI + 0x10) = this_00;
  InputPart::header((InputPart *)0x222aab);
  anon_unknown_1::prefixFromLayerName(in_stack_ffffffffffffff88,in_stack_ffffffffffffff80);
  std::__cxx11::string::operator=((string *)(in_RDI + 0x20),local_48);
  std::__cxx11::string::~string(local_48);
  RVar2 = channels(in_stack_ffffffffffffff50);
  if ((RVar2 & WRITE_C) != 0) {
    in_stack_ffffffffffffff50 = (RgbaInputFile *)operator_new(0x188);
    FromYca::FromYca((FromYca *)CONCAT44(in_ESI,in_stack_fffffffffffffff0),in_RDX,
                     in_stack_ffffffffffffffe4);
    *(RgbaInputFile **)(in_RDI + 0x18) = in_stack_ffffffffffffff50;
  }
  frameBuffer = (FrameBuffer *)&stack0xffffffffffffff80;
  FrameBuffer::FrameBuffer((FrameBuffer *)0x222b89);
  InputPart::setFrameBuffer((InputPart *)in_stack_ffffffffffffff50,frameBuffer);
  FrameBuffer::~FrameBuffer((FrameBuffer *)0x222ba7);
  return;
}

Assistant:

void
RgbaInputFile::setPartAndLayer (int part, const string& layerName)
{
    delete _fromYca;
    _fromYca = nullptr;
    delete _inputPart;
    _inputPart = nullptr;

    _inputPart         = new InputPart (*_multiPartFile, part);
    _channelNamePrefix = prefixFromLayerName (layerName, _inputPart->header ());
    ;

    RgbaChannels rgbaChannels = channels ();

    if (rgbaChannels & WRITE_C)
        _fromYca = new FromYca (*_inputPart, rgbaChannels);

    FrameBuffer fb;
    _inputPart->setFrameBuffer (fb);
}